

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

double __thiscall mp::PLTerm::breakpoint(PLTerm *this,int index)

{
  Impl *pIVar1;
  int in_ESI;
  
  pIVar1 = impl((PLTerm *)0x19c0d7);
  return pIVar1->data[in_ESI * 2 + 1];
}

Assistant:

double breakpoint(int index) const {
    MP_ASSERT(index >= 0 && index < num_breakpoints(), "index out of bounds");
    return impl()->data[2 * index + 1];
  }